

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O1

Cut_Cut_t *
Cut_NodeComputeCuts(Cut_Man_t *p,int Node,int Node0,int Node1,int fCompl0,int fCompl1,int fTriv,
                   int TreeCode)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  Cut_Cut_t *pCVar5;
  long lVar6;
  Cut_Cut_t *pCVar7;
  Cut_Cut_t **ppCVar8;
  int *piVar9;
  void **ppvVar10;
  Vec_Ptr_t *pVVar11;
  Cut_Cut_t *pCVar12;
  long lVar13;
  Cut_Cut_t *pCut1;
  int iVar14;
  int iVar15;
  Cut_Cut_t *pHead;
  long local_108;
  Cut_List_t Super;
  
  p->nNodes = p->nNodes + 1;
  p->nNodeCuts = 0;
  if (p->pParams->fRecord != 0) {
    pCVar5 = Cut_NodeReadCutsNew(p,Node0);
    Cut_CutNumberList(pCVar5);
    pCVar5 = Cut_NodeReadCutsNew(p,Node1);
    Cut_CutNumberList(pCVar5);
  }
  iVar4 = clock_gettime(3,(timespec *)&Super);
  if (iVar4 < 0) {
    lVar13 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)Super.pHead[1]),8);
    lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + (long)Super.pHead[0] * -1000000;
  }
  Super.pHead[1] = (Cut_Cut_t *)0x0;
  Super.pHead[2] = (Cut_Cut_t *)0x0;
  Super.pHead[3] = (Cut_Cut_t *)0x0;
  Super.pHead[4] = (Cut_Cut_t *)0x0;
  Super.pHead[5] = (Cut_Cut_t *)0x0;
  Super.pHead[6] = (Cut_Cut_t *)0x0;
  Super.pHead[7] = (Cut_Cut_t *)0x0;
  Super.pHead[8] = (Cut_Cut_t *)0x0;
  Super.pHead[9] = (Cut_Cut_t *)0x0;
  Super.pHead[10] = (Cut_Cut_t *)0x0;
  Super.pHead[0xb] = (Cut_Cut_t *)0x0;
  Super.pHead[0xc] = (Cut_Cut_t *)0x0;
  lVar6 = 8;
  do {
    *(long *)((long)Super.ppTail + lVar6) = (long)Super.pHead + lVar6;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x68);
  pCVar5 = Cut_NodeReadCutsNew(p,Node0);
  pCVar7 = Cut_NodeReadCutsNew(p,Node1);
  Cut_NodeDoComputeCuts(p,&Super,Node,fCompl0,fCompl1,pCVar5,pCVar7,fTriv,TreeCode);
  ppCVar8 = &pHead;
  pHead = (Cut_Cut_t *)0x0;
  lVar6 = 1;
  do {
    if (Super.pHead[lVar6] != (Cut_Cut_t *)0x0) {
      *ppCVar8 = Super.pHead[lVar6];
      ppCVar8 = Super.ppTail[lVar6];
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xd);
  *ppCVar8 = (Cut_Cut_t *)0x0;
  pCVar5 = pHead;
  iVar4 = clock_gettime(3,(timespec *)&pHead);
  if (iVar4 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_108 / 1000 + (long)pHead * 1000000;
  }
  p->timeMerge = p->timeMerge + lVar6 + lVar13;
  if (p->pParams->fRecord != 0) {
    if ((Node < 0) || (p->vNodeStarts->nSize <= Node)) goto LAB_004af361;
    p->vNodeStarts->pArray[(uint)Node] = p->vCutPairs->nSize;
    for (pCVar7 = pCVar5; pCVar7 != (Cut_Cut_t *)0x0; pCVar7 = pCVar7->pNext) {
      pVVar3 = p->vCutPairs;
      uVar1 = *(uint *)pCVar7;
      uVar2 = pVVar3->nCap;
      if (pVVar3->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar3->pArray == (int *)0x0) {
            piVar9 = (int *)malloc(0x40);
          }
          else {
            piVar9 = (int *)realloc(pVVar3->pArray,0x40);
          }
          pVVar3->pArray = piVar9;
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar2 * 2;
          if (iVar4 <= (int)uVar2) goto LAB_004aef2c;
          if (pVVar3->pArray == (int *)0x0) {
            piVar9 = (int *)malloc((ulong)uVar2 << 3);
          }
          else {
            piVar9 = (int *)realloc(pVVar3->pArray,(ulong)uVar2 << 3);
          }
          pVVar3->pArray = piVar9;
        }
        if (piVar9 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar3->nCap = iVar4;
      }
LAB_004aef2c:
      iVar4 = pVVar3->nSize;
      pVVar3->nSize = iVar4 + 1;
      pVVar3->pArray[iVar4] = uVar1 & 0x7ff | (uVar1 & 0x3ff800) << 5;
    }
    if (p->vNodeStarts->nSize <= Node) goto LAB_004af380;
    if (p->vNodeCuts->nSize <= Node) goto LAB_004af361;
    p->vNodeCuts->pArray[(uint)Node] = p->vCutPairs->nSize - p->vNodeStarts->pArray[(uint)Node];
  }
  pCVar7 = pCVar5;
  if (pCVar5 != (Cut_Cut_t *)0x0 && p->pParams->fRecordAig != 0) {
    do {
      uVar1 = *(uint *)pCVar7;
      if (0x4fffffff < uVar1) {
        Aig_RManRecord((uint *)((long)&pCVar7[1].field_0x0 + (ulong)(uVar1 >> 0x16 & 0x3c)),
                       uVar1 >> 0x1c);
      }
      ppCVar8 = &pCVar7->pNext;
      pCVar7 = *ppCVar8;
    } while (*ppCVar8 != (Cut_Cut_t *)0x0);
  }
  if (p->nNodeCuts == p->pParams->nKeepMax) {
    p->nCutsLimit = p->nCutsLimit + 1;
  }
  pVVar11 = p->vCutsNew;
  if (pVVar11->nSize <= Node) {
    iVar14 = Node + 1;
    iVar4 = pVVar11->nCap;
    iVar15 = iVar4 * 2;
    if (Node < iVar15) {
      if (iVar4 < iVar15 && iVar4 <= Node) {
        if (pVVar11->pArray == (void **)0x0) {
          ppvVar10 = (void **)malloc((long)iVar4 << 4);
        }
        else {
          ppvVar10 = (void **)realloc(pVVar11->pArray,(long)iVar4 << 4);
        }
        pVVar11->pArray = ppvVar10;
LAB_004af080:
        pVVar11->nCap = iVar15;
      }
    }
    else if (iVar4 <= Node) {
      if (pVVar11->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc((long)iVar14 << 3);
      }
      else {
        ppvVar10 = (void **)realloc(pVVar11->pArray,(long)iVar14 << 3);
      }
      pVVar11->pArray = ppvVar10;
      iVar15 = iVar14;
      goto LAB_004af080;
    }
    lVar13 = (long)pVVar11->nSize;
    if (pVVar11->nSize <= Node) {
      do {
        pVVar11->pArray[lVar13] = (void *)0x0;
        lVar13 = lVar13 + 1;
      } while (iVar14 != lVar13);
    }
    pVVar11->nSize = iVar14;
  }
  pCVar7 = Cut_NodeReadCutsNew(p,Node);
  if (pCVar7 != (Cut_Cut_t *)0x0) {
    __assert_fail("Cut_NodeReadCutsNew(p, Node) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                  ,0x19b,
                  "Cut_Cut_t *Cut_NodeComputeCuts(Cut_Man_t *, int, int, int, int, int, int, int)");
  }
  Cut_NodeWriteCutsNew(p,Node,pCVar5);
  iVar4 = clock_gettime(3,(timespec *)&pHead);
  if (iVar4 < 0) {
    lVar13 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_108),8);
    lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + (long)pHead * -1000000;
  }
  if ((p->pParams->fMap != 0) && (p->pParams->fSeq == 0)) {
    if (-1 < Node0) {
      iVar4 = p->vDelays2->nSize;
      if (((Node0 < iVar4) && (-1 < Node1)) && (Node1 < iVar4)) {
        piVar9 = p->vDelays2->pArray;
        iVar4 = piVar9[(uint)Node0];
        iVar15 = piVar9[(uint)Node1];
        if (iVar4 == 0) {
          pVVar11 = p->vCutsNew;
        }
        else {
          pVVar11 = p->vCutsMax;
        }
        if (Node0 < pVVar11->nSize) {
          pCVar7 = (Cut_Cut_t *)pVVar11->pArray[(uint)Node0];
          if (iVar15 == 0) {
            pVVar11 = p->vCutsNew;
          }
          else {
            pVVar11 = p->vCutsMax;
          }
          if (Node1 < pVVar11->nSize) {
            pCVar12 = (Cut_Cut_t *)pVVar11->pArray[(uint)Node1];
            if (iVar4 == iVar15) {
              iVar15 = iVar4 + (uint)(iVar4 == 0);
            }
            else {
              pVVar11 = p->vCutsNew;
              if (iVar15 < iVar4) {
                if (pVVar11->nSize <= Node1) goto LAB_004af3be;
                pCVar12 = (Cut_Cut_t *)pVVar11->pArray[(uint)Node1];
                iVar15 = iVar4;
                if (((undefined1  [24])*pCVar12 & (undefined1  [24])0xf0000000) !=
                    (undefined1  [24])0x10000000) {
                  __assert_fail("pCut1->nLeaves == 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                                ,0x1f8,
                                "int Cut_NodeMapping(Cut_Man_t *, Cut_Cut_t *, int, int, int)");
                }
              }
              else {
                if (pVVar11->nSize <= Node0) goto LAB_004af3be;
                pCVar7 = (Cut_Cut_t *)pVVar11->pArray[(uint)Node0];
                if (((undefined1  [24])*pCVar7 & (undefined1  [24])0xf0000000) !=
                    (undefined1  [24])0x10000000) {
                  __assert_fail("pCut0->nLeaves == 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                                ,0x1fe,
                                "int Cut_NodeMapping(Cut_Man_t *, Cut_Cut_t *, int, int, int)");
                }
              }
            }
            pCut1 = pCVar12;
            if (*(uint *)pCVar7 >> 0x1c < *(uint *)pCVar12 >> 0x1c) {
              pCut1 = pCVar7;
              pCVar7 = pCVar12;
            }
            pCVar7 = Cut_CutMergeTwo(p,pCVar7,pCut1);
            if (pCVar7 == (Cut_Cut_t *)0x0) {
              iVar15 = iVar15 + 1;
              pCVar7 = Cut_CutAlloc(p);
              *(uint *)pCVar7 = *(uint *)pCVar7 & 0xfffffff | 0x20000000;
              iVar4 = Node1;
              if (Node0 < Node1) {
                iVar4 = Node0;
              }
              *(int *)(pCVar7 + 1) = iVar4;
              if (Node1 < Node0) {
                Node1 = Node0;
              }
              pCVar7[1].uSign = Node1;
            }
            if (iVar15 < 1) {
              __assert_fail("Delay > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutNode.c"
                            ,0x20d,"int Cut_NodeMapping(Cut_Man_t *, Cut_Cut_t *, int, int, int)");
            }
            if ((Node < 0) || (p->vDelays2->nSize <= Node)) {
LAB_004af361:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            p->vDelays2->pArray[(uint)Node] = iVar15;
            if (p->vCutsMax->nSize <= Node) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
            }
            p->vCutsMax->pArray[(uint)Node] = pCVar7;
            if (p->nDelayMin < iVar15) {
              p->nDelayMin = iVar15;
            }
            goto LAB_004af2dc;
          }
        }
LAB_004af3be:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
    }
LAB_004af380:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_004af2dc:
  iVar4 = clock_gettime(3,(timespec *)&pHead);
  if (iVar4 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_108 / 1000 + (long)pHead * 1000000;
  }
  p->timeMap = p->timeMap + lVar6 + lVar13;
  return pCVar5;
}

Assistant:

Cut_Cut_t * Cut_NodeComputeCuts( Cut_Man_t * p, int Node, int Node0, int Node1, int fCompl0, int fCompl1, int fTriv, int TreeCode )
{
    Cut_List_t Super, * pSuper = &Super;
    Cut_Cut_t * pList, * pCut;
    abctime clk;
    // start the number of cuts at the node
    p->nNodes++;
    p->nNodeCuts = 0;
    // prepare information for recording
    if ( p->pParams->fRecord )
    {
        Cut_CutNumberList( Cut_NodeReadCutsNew(p, Node0) );
        Cut_CutNumberList( Cut_NodeReadCutsNew(p, Node1) );
    }
    // compute the cuts
clk = Abc_Clock();
    Cut_ListStart( pSuper );
    Cut_NodeDoComputeCuts( p, pSuper, Node, fCompl0, fCompl1, Cut_NodeReadCutsNew(p, Node0), Cut_NodeReadCutsNew(p, Node1), fTriv, TreeCode );
    pList = Cut_ListFinish( pSuper );
p->timeMerge += Abc_Clock() - clk;
    // verify the result of cut computation
//    Cut_CutListVerify( pList );
    // performing the recording
    if ( p->pParams->fRecord )
    {
        Vec_IntWriteEntry( p->vNodeStarts, Node, Vec_IntSize(p->vCutPairs) );
        Cut_ListForEachCut( pList, pCut )
            Vec_IntPush( p->vCutPairs, ((pCut->Num1 << 16) | pCut->Num0) );
        Vec_IntWriteEntry( p->vNodeCuts, Node, Vec_IntSize(p->vCutPairs) - Vec_IntEntry(p->vNodeStarts, Node) );
    }
    if ( p->pParams->fRecordAig )
    {
        extern void Aig_RManRecord( unsigned * pTruth, int nVarsInit );
        Cut_ListForEachCut( pList, pCut )
            if ( Cut_CutReadLeaveNum(pCut) > 4 )
                Aig_RManRecord( Cut_CutReadTruth(pCut), Cut_CutReadLeaveNum(pCut) );
    }
    // check if the node is over the list
    if ( p->nNodeCuts == p->pParams->nKeepMax )
        p->nCutsLimit++;
    // set the list at the node
    Vec_PtrFillExtra( p->vCutsNew, Node + 1, NULL );
    assert( Cut_NodeReadCutsNew(p, Node) == NULL );
    /////
//    pList->pNext = NULL;
    /////
    Cut_NodeWriteCutsNew( p, Node, pList );
    // filter the cuts
//clk = Abc_Clock();
//    if ( p->pParams->fFilter )
//        Cut_CutFilter( p, pList0 );
//p->timeFilter += Abc_Clock() - clk;
    // perform mapping of this node with these cuts
clk = Abc_Clock();
    if ( p->pParams->fMap && !p->pParams->fSeq )
    {
//        int Delay1, Delay2;
//        Delay1 = Cut_NodeMapping( p, pList, Node, Node0, Node1 );    
//        Delay2 = Cut_NodeMapping2( p, pList, Node, Node0, Node1 );   
//        assert( Delay1 >= Delay2 );
        Cut_NodeMapping( p, pList, Node, Node0, Node1 );
    }
p->timeMap += Abc_Clock() - clk;
    return pList;
}